

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O3

void IntegrateFrequencyTable
               (BSDF *bsdf,Vector3f *wo,int sampleCount,int thetaRes,int phiRes,Float *target)

{
  int iVar1;
  int iVar2;
  Float FVar3;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  BSDF *local_38;
  
  iVar2 = 0;
  local_38 = bsdf;
  memset(target,0,(long)(phiRes * thetaRes) << 2);
  if (0 < thetaRes) {
    do {
      if (0 < phiRes) {
        iVar1 = 0;
        do {
          local_58._M_unused._M_object = &local_38;
          local_40 = std::
                     _Function_handler<float_(float,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:228:21)>
                     ::_M_invoke;
          local_48 = std::
                     _Function_handler<float_(float,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:228:21)>
                     ::_M_manager;
          local_58._8_8_ = wo;
          FVar3 = AdaptiveSimpson2D((function<float_(float,_float)> *)&local_58,
                                    (3.1415927 / (float)thetaRes) * (float)iVar2,
                                    (6.2831855 / (float)phiRes) * (float)iVar1,
                                    (3.1415927 / (float)thetaRes) * (float)(iVar2 + 1),
                                    (6.2831855 / (float)phiRes) * (float)(iVar1 + 1),1e-06,6);
          *target = FVar3 * (float)sampleCount;
          if (local_48 != (code *)0x0) {
            (*local_48)(&local_58,&local_58,__destroy_functor);
          }
          target = target + 1;
          iVar1 = iVar1 + 1;
        } while (phiRes != iVar1);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != thetaRes);
  }
  return;
}

Assistant:

void IntegrateFrequencyTable(const BSDF* bsdf, const Vector3f& wo, int sampleCount,
                             int thetaRes, int phiRes, Float* target) {
    memset(target, 0, thetaRes * phiRes * sizeof(Float));

    Float factorTheta = Pi / thetaRes, factorPhi = (2 * Pi) / phiRes;

    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            *target++ =
                sampleCount *
                AdaptiveSimpson2D(
                    [&](Float theta, Float phi) -> Float {
                        Float cosTheta = std::cos(theta), sinTheta = std::sin(theta);
                        Float cosPhi = std::cos(phi), sinPhi = std::sin(phi);
                        Vector3f wiL(sinTheta * cosPhi, sinTheta * sinPhi, cosTheta);
                        return bsdf->PDF(wo, bsdf->LocalToRender(wiL)) * sinTheta;
                    },
                    i* factorTheta, j* factorPhi, (i + 1) * factorTheta,
                    (j + 1) * factorPhi);
        }
    }
}